

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ComputeGeneratedColumns(Parse *pParse,int iRegStore,Table *pTab)

{
  byte *pbVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort uVar4;
  Vdbe *pVVar5;
  char *pcVar6;
  Column *pCVar7;
  Column *pCVar8;
  ExprList *pEVar9;
  Expr *pExpr;
  bool bVar10;
  i16 iVar11;
  Op *pOVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  Column *local_68;
  Walker local_60;
  
  sqlite3TableAffinity(pParse->pVdbe,pTab,iRegStore);
  if ((pTab->tabFlags & 0x40) != 0) {
    pVVar5 = pParse->pVdbe;
    if (pVVar5->db->mallocFailed == '\0') {
      pOVar12 = pVVar5->aOp + (long)pVVar5->nOp + -1;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pOVar12->opcode == '_') {
      pOVar12->p3 = 1;
    }
    else if ((pOVar12->opcode == '`') && (pcVar6 = (pOVar12->p4).z, *pcVar6 != '\0')) {
      iVar13 = 0;
      lVar14 = 0xe;
      pcVar15 = pcVar6;
      do {
        uVar3 = *(ushort *)((long)&pTab->aCol->zCnName + lVar14);
        if ((uVar3 & 0x20) == 0) {
          if ((uVar3 & 0x40) != 0) {
            *pcVar15 = '@';
          }
          iVar13 = iVar13 + 1;
        }
        pcVar15 = pcVar6 + iVar13;
        lVar14 = lVar14 + 0x10;
      } while (pcVar6[iVar13] != '\0');
    }
  }
  lVar14 = (long)pTab->nCol;
  if (0 < lVar14) {
    pCVar7 = pTab->aCol;
    lVar16 = 0;
    do {
      uVar3 = *(ushort *)((long)&pCVar7->colFlags + lVar16);
      if ((uVar3 & 0x60) != 0) {
        *(ushort *)((long)&pCVar7->colFlags + lVar16) = uVar3 | 0x80;
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar14 << 4 != lVar16);
  }
  local_60.xExprCallback = exprColumnFlagUnion;
  local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  pParse->iSelfTab = -iRegStore;
  local_60.u.pTab = pTab;
  do {
    if ((short)lVar14 < 1) goto LAB_00198c32;
    lVar17 = 0;
    lVar16 = 0;
    local_68 = (Column *)0x0;
    bVar10 = false;
    do {
      pCVar8 = pTab->aCol;
      uVar3 = *(ushort *)((long)&pCVar8->colFlags + lVar17);
      pCVar7 = local_68;
      if ((char)uVar3 < '\0') {
        pCVar7 = (Column *)((long)&pCVar8->zCnName + lVar17);
        *(ushort *)((long)&pCVar8->colFlags + lVar17) = uVar3 | 0x100;
        local_60.eCode = 0;
        uVar4 = *(ushort *)((long)&pCVar8->iDflt + lVar17);
        if ((((uVar4 == 0) || (pTab->eTabType != '\0')) ||
            (pEVar9 = (pTab->u).tab.pDfltList, pEVar9 == (ExprList *)0x0)) ||
           ((pEVar9->nExpr < (int)(uint)uVar4 ||
            (pExpr = pEVar9->a[uVar4 - 1].pExpr, pExpr == (Expr *)0x0)))) {
          *(ushort *)((long)&pCVar8->colFlags + lVar17) = uVar3 & 0xfeff;
        }
        else {
          sqlite3WalkExprNN(&local_60,pExpr);
          puVar2 = (ushort *)((long)&pCVar8->colFlags + lVar17);
          *puVar2 = *puVar2 & 0xfeff;
          if ((char)local_60.eCode < '\0') goto LAB_00198bb1;
        }
        iVar11 = sqlite3TableColumnToStorage(pTab,(i16)lVar16);
        sqlite3ExprCodeGeneratedColumn(pParse,pTab,pCVar7,iVar11 + iRegStore);
        pbVar1 = (byte *)((long)&pCVar8->colFlags + lVar17);
        *pbVar1 = *pbVar1 & 0x7f;
        bVar10 = true;
        pCVar7 = local_68;
      }
LAB_00198bb1:
      local_68 = pCVar7;
      lVar16 = lVar16 + 1;
      lVar14 = (long)pTab->nCol;
      lVar17 = lVar17 + 0x10;
    } while (lVar16 < lVar14);
  } while ((local_68 != (Column *)0x0) && (bVar10));
  if (local_68 != (Column *)0x0) {
    sqlite3ErrorMsg(pParse,"generated column loop on \"%s\"",local_68->zCnName);
  }
LAB_00198c32:
  pParse->iSelfTab = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ComputeGeneratedColumns(
  Parse *pParse,    /* Parsing context */
  int iRegStore,    /* Register holding the first column */
  Table *pTab       /* The table */
){
  int i;
  Walker w;
  Column *pRedo;
  int eProgress;
  VdbeOp *pOp;

  assert( pTab->tabFlags & TF_HasGenerated );
  testcase( pTab->tabFlags & TF_HasVirtual );
  testcase( pTab->tabFlags & TF_HasStored );

  /* Before computing generated columns, first go through and make sure
  ** that appropriate affinity has been applied to the regular columns
  */
  sqlite3TableAffinity(pParse->pVdbe, pTab, iRegStore);
  if( (pTab->tabFlags & TF_HasStored)!=0 ){
    pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Affinity ){
      /* Change the OP_Affinity argument to '@' (NONE) for all stored
      ** columns.  '@' is the no-op affinity and those columns have not
      ** yet been computed. */
      int ii, jj;
      char *zP4 = pOp->p4.z;
      assert( zP4!=0 );
      assert( pOp->p4type==P4_DYNAMIC );
      for(ii=jj=0; zP4[jj]; ii++){
        if( pTab->aCol[ii].colFlags & COLFLAG_VIRTUAL ){
          continue;
        }
        if( pTab->aCol[ii].colFlags & COLFLAG_STORED ){
          zP4[jj] = SQLITE_AFF_NONE;
        }
        jj++;
      }
    }else if( pOp->opcode==OP_TypeCheck ){
      /* If an OP_TypeCheck was generated because the table is STRICT,
      ** then set the P3 operand to indicate that generated columns should
      ** not be checked */
      pOp->p3 = 1;
    }
  }

  /* Because there can be multiple generated columns that refer to one another,
  ** this is a two-pass algorithm.  On the first pass, mark all generated
  ** columns as "not available".
  */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].colFlags & COLFLAG_GENERATED ){
      testcase( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL );
      testcase( pTab->aCol[i].colFlags & COLFLAG_STORED );
      pTab->aCol[i].colFlags |= COLFLAG_NOTAVAIL;
    }
  }

  w.u.pTab = pTab;
  w.xExprCallback = exprColumnFlagUnion;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;

  /* On the second pass, compute the value of each NOT-AVAILABLE column.
  ** Companion code in the TK_COLUMN case of sqlite3ExprCodeTarget() will
  ** compute dependencies and mark remove the COLSPAN_NOTAVAIL mark, as
  ** they are needed.
  */
  pParse->iSelfTab = -iRegStore;
  do{
    eProgress = 0;
    pRedo = 0;
    for(i=0; i<pTab->nCol; i++){
      Column *pCol = pTab->aCol + i;
      if( (pCol->colFlags & COLFLAG_NOTAVAIL)!=0 ){
        int x;
        pCol->colFlags |= COLFLAG_BUSY;
        w.eCode = 0;
        sqlite3WalkExpr(&w, sqlite3ColumnExpr(pTab, pCol));
        pCol->colFlags &= ~COLFLAG_BUSY;
        if( w.eCode & COLFLAG_NOTAVAIL ){
          pRedo = pCol;
          continue;
        }
        eProgress = 1;
        assert( pCol->colFlags & COLFLAG_GENERATED );
        x = sqlite3TableColumnToStorage(pTab, i) + iRegStore;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, x);
        pCol->colFlags &= ~COLFLAG_NOTAVAIL;
      }
    }
  }while( pRedo && eProgress );
  if( pRedo ){
    sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"", pRedo->zCnName);
  }
  pParse->iSelfTab = 0;
}